

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

Totals * __thiscall Catch::Totals::operator-(Totals *this,Totals *other)

{
  uint64_t uVar1;
  uint64_t uVar2;
  Totals *in_RDI;
  
  uVar1 = (this->assertions).failed;
  uVar2 = (other->assertions).failed;
  (in_RDI->assertions).passed = (this->assertions).passed - (other->assertions).passed;
  (in_RDI->assertions).failed = uVar1 - uVar2;
  uVar1 = (this->assertions).skipped;
  uVar2 = (other->assertions).skipped;
  (in_RDI->assertions).failedButOk =
       (this->assertions).failedButOk - (other->assertions).failedButOk;
  (in_RDI->assertions).skipped = uVar1 - uVar2;
  uVar1 = (this->testCases).failed;
  uVar2 = (other->testCases).failed;
  (in_RDI->testCases).passed = (this->testCases).passed - (other->testCases).passed;
  (in_RDI->testCases).failed = uVar1 - uVar2;
  uVar1 = (this->testCases).skipped;
  uVar2 = (other->testCases).skipped;
  (in_RDI->testCases).failedButOk = (this->testCases).failedButOk - (other->testCases).failedButOk;
  (in_RDI->testCases).skipped = uVar1 - uVar2;
  return in_RDI;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }